

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O0

void __thiscall p2t::Triangle::MarkNeighbor(Triangle *this,Point *p1,Point *p2,Triangle *t)

{
  Triangle *t_local;
  Point *p2_local;
  Point *p1_local;
  Triangle *this_local;
  
  if (((p1 == this->points_[2]) && (p2 == this->points_[1])) ||
     ((p1 == this->points_[1] && (p2 == this->points_[2])))) {
    this->neighbors_[0] = t;
  }
  else if (((p1 == this->points_[0]) && (p2 == this->points_[2])) ||
          ((p1 == this->points_[2] && (p2 == this->points_[0])))) {
    this->neighbors_[1] = t;
  }
  else {
    if (((p1 != this->points_[0]) || (p2 != this->points_[1])) &&
       ((p1 != this->points_[1] || (p2 != this->points_[0])))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/poly2tri/poly2tri/common/shapes.cc"
                    ,0x37,"void p2t::Triangle::MarkNeighbor(Point *, Point *, Triangle *)");
    }
    this->neighbors_[2] = t;
  }
  return;
}

Assistant:

void Triangle::MarkNeighbor(Point* p1, Point* p2, Triangle* t)
{
  if ((p1 == points_[2] && p2 == points_[1]) || (p1 == points_[1] && p2 == points_[2]))
    neighbors_[0] = t;
  else if ((p1 == points_[0] && p2 == points_[2]) || (p1 == points_[2] && p2 == points_[0]))
    neighbors_[1] = t;
  else if ((p1 == points_[0] && p2 == points_[1]) || (p1 == points_[1] && p2 == points_[0]))
    neighbors_[2] = t;
  else
    assert(0);
}